

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pager_write_changecounter(PgHdr *pPg)

{
  u32 uVar1;
  u32 change_counter;
  PgHdr *pPg_local;
  
  if (pPg != (PgHdr *)0x0) {
    uVar1 = sqlite3Get4byte((u8 *)pPg->pPager->dbFileVers);
    sqlite3Put4byte((uchar *)((long)pPg->pData + 0x18),uVar1 + 1);
    sqlite3Put4byte((uchar *)((long)pPg->pData + 0x5c),uVar1 + 1);
    sqlite3Put4byte((uchar *)((long)pPg->pData + 0x60),0x2e6300);
  }
  return;
}

Assistant:

static void pager_write_changecounter(PgHdr *pPg){
  u32 change_counter;
  if( NEVER(pPg==0) ) return;

  /* Increment the value just read and write it back to byte 24. */
  change_counter = sqlite3Get4byte((u8*)pPg->pPager->dbFileVers)+1;
  put32bits(((char*)pPg->pData)+24, change_counter);

  /* Also store the SQLite version number in bytes 96..99 and in
  ** bytes 92..95 store the change counter for which the version number
  ** is valid. */
  put32bits(((char*)pPg->pData)+92, change_counter);
  put32bits(((char*)pPg->pData)+96, SQLITE_VERSION_NUMBER);
}